

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  void *__s1;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  uint *puVar8;
  size_t sVar9;
  long lVar10;
  uchar *in_RDX;
  ulong uVar11;
  ulong uVar12;
  ulong unaff_RBP;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(params + 8) != 0) {
    lVar10 = *(long *)params;
    sVar7 = strlen((char *)in_RDX);
    s.size_ = sVar7;
    s.ptr = in_RDX;
    uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    lVar2 = *(long *)(params[6] + 6);
    uVar3 = *(ulong *)(params + 8);
    uVar11 = (ulong)((int)uVar3 - 1U & uVar5);
    uVar1 = *(uint *)(lVar2 + 4 + uVar11 * 8);
    unaff_RBP = (ulong)uVar1;
    if (uVar1 != 0) {
      puVar8 = (uint *)(lVar2 + uVar11 * 8);
      do {
        if (((int)unaff_RBP != 1) && (*puVar8 == uVar5)) {
          unaff_RBP = (ulong)((int)unaff_RBP - 2);
          __s1 = *(void **)(lVar10 + unaff_RBP * 0x18);
          sVar7 = *(size_t *)(lVar10 + 8 + unaff_RBP * 0x18);
          sVar9 = strlen((char *)in_RDX);
          if ((sVar7 == sVar9 + 1) &&
             ((bVar4 = true, sVar7 == 0 || (iVar6 = bcmp(__s1,in_RDX,sVar7), iVar6 == 0)))) break;
        }
        uVar12 = uVar11 + 1;
        bVar4 = false;
        uVar11 = 0;
        if (uVar12 != uVar3) {
          uVar11 = uVar12 & 0xffffffff;
        }
        puVar8 = (uint *)(lVar2 + uVar11 * 8);
        unaff_RBP = (ulong)puVar8[1];
      } while (puVar8[1] != 0);
      goto LAB_001614e2;
    }
  }
  bVar4 = false;
LAB_001614e2:
  lVar10 = 0;
  if (bVar4) {
    lVar10 = unaff_RBP * 0x18 + *(long *)params;
  }
  *(long *)this = lVar10;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}